

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PtexSeparableKernel.cpp
# Opt level: O3

void Ptex::v2_2::anon_unknown_4::ApplyN<float>
               (PtexSeparableKernel *k,float *result,void *data,int nChan,int nTxChan)

{
  void *pvVar1;
  void *pvVar2;
  float fVar3;
  byte bVar4;
  float *pfVar5;
  ulong uVar6;
  long lVar7;
  long lVar8;
  ulong uVar9;
  float *pfVar10;
  void *pvVar11;
  int iVar12;
  float *pfVar13;
  long lVar14;
  int iVar15;
  float afStack_48 [2];
  void *local_40;
  int local_34;
  
  uVar6 = (ulong)(uint)nChan;
  lVar7 = -0x48 - ((long)nChan * 4 + 0xfU & 0xfffffffffffffff0);
  bVar4 = (k->res).ulog2;
  local_34 = nTxChan;
  iVar15 = nTxChan << (bVar4 & 0x1f);
  lVar8 = (long)iVar15 * (long)k->vw;
  if ((int)lVar8 != 0) {
    pvVar11 = (void *)((long)data + (long)(((k->v << (bVar4 & 0x1f)) + k->u) * nTxChan) * 4);
    local_40 = (void *)((long)pvVar11 + lVar8 * 4);
    pfVar5 = k->ku;
    pfVar13 = k->kv;
    lVar14 = (long)nTxChan;
    lVar8 = k->uw * lVar14;
    iVar12 = (int)lVar8;
    do {
      if (0 < nChan) {
        fVar3 = *pfVar5;
        uVar9 = 0;
        do {
          *(float *)((long)afStack_48 + uVar9 * 4 + lVar7 + 0x48) =
               *(float *)((long)pvVar11 + uVar9 * 4) * fVar3;
          uVar9 = uVar9 + 1;
        } while (uVar6 != uVar9);
      }
      if (iVar12 != local_34) {
        pvVar1 = (void *)((long)pvVar11 + lVar8 * 4);
        pfVar10 = pfVar5;
        pvVar2 = (void *)((long)pvVar11 + lVar14 * 4);
        do {
          pvVar11 = pvVar2;
          if (0 < nChan) {
            fVar3 = pfVar10[1];
            uVar9 = 0;
            do {
              *(float *)((long)afStack_48 + uVar9 * 4 + lVar7 + 0x48) =
                   *(float *)((long)pvVar11 + uVar9 * 4) * fVar3 +
                   *(float *)((long)afStack_48 + uVar9 * 4 + lVar7 + 0x48);
              uVar9 = uVar9 + 1;
            } while (uVar6 != uVar9);
          }
          pfVar10 = pfVar10 + 1;
          pvVar2 = (void *)((long)pvVar11 + lVar14 * 4);
        } while (pvVar2 != pvVar1);
      }
      if (0 < nChan) {
        fVar3 = *pfVar13;
        uVar9 = 0;
        do {
          result[uVar9] =
               *(float *)((long)afStack_48 + uVar9 * 4 + lVar7 + 0x48) * fVar3 + result[uVar9];
          uVar9 = uVar9 + 1;
        } while (uVar6 != uVar9);
      }
      pfVar13 = pfVar13 + 1;
      pvVar11 = (void *)((long)pvVar11 + (long)(iVar15 - iVar12) * 4 + lVar14 * 4);
    } while (pvVar11 != local_40);
  }
  return;
}

Assistant:

void ApplyN(PtexSeparableKernel& k, float* result, void* data, int nChan, int nTxChan)
    {
        float* rowResult = (float*) alloca(nChan*sizeof(float));
        int rowlen = k.res.u() * nTxChan;
        int datalen = k.uw * nTxChan;
        int rowskip = rowlen - datalen;
        float* kvp = k.kv;
        T* p = static_cast<T*>(data) + (k.v * k.res.u() + k.u) * nTxChan;
        T* pEnd = p + k.vw * rowlen;
        while (p != pEnd)
        {
            float* kup = k.ku;
            T* pRowEnd = p + datalen;
            // just mult and copy first element
            PtexUtils::VecMultN<T>()(rowResult, p, nChan, *kup++);
            p += nTxChan;
            // accumulate remaining elements
            while (p != pRowEnd) {
                // rowResult[i] = p[i] * ku[u] for i in {0..n-1}
                PtexUtils::VecAccumN<T>()(rowResult, p, nChan, *kup++);
                p += nTxChan;
            }
            // result[i] += rowResult[i] * kv[v] for i in {0..n-1}
            PtexUtils::VecAccumN<float>()(result, rowResult, nChan, *kvp++);
            p += rowskip;
        }
    }